

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void h2o_cache_delete(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  khint_t iter_00;
  undefined1 auStack_90 [4];
  khiter_t iter;
  h2o_cache_ref_t search_key;
  h2o_cache_hashcode_t keyhash_local;
  uint64_t now_local;
  h2o_cache_t *cache_local;
  h2o_iovec_t key_local;
  
  search_key._refcnt._4_4_ = keyhash;
  if (keyhash == 0) {
    search_key._refcnt._4_4_ = h2o_cache_calchash(key.base,key.len);
  }
  search_key.key.len._0_4_ = search_key._refcnt._4_4_;
  _auStack_90 = key.base;
  search_key.key.base = (char *)key.len;
  lock_cache(cache);
  purge(cache,now);
  iter_00 = kh_get_cache(cache->table,(h2o_cache_ref_t *)auStack_90);
  if (iter_00 != cache->table->n_buckets) {
    erase_ref(cache,iter_00,0);
  }
  unlock_cache(cache);
  return;
}

Assistant:

void h2o_cache_delete(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key;
    khiter_t iter;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) != kh_end(cache->table))
        erase_ref(cache, iter, 0);

    unlock_cache(cache);
}